

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O2

void writeHash2<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,SeedType *seed,
               size_t n1,size_t n2,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *layer1,
               string *hash_str,string map_name,string *default_value,bool nonKeyLookups)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t seed_00;
  pointer puVar3;
  pointer puVar4;
  pointer pBVar5;
  size_t n2_00;
  int iVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  pointer pBVar11;
  ulong uVar12;
  size_type sVar13;
  string upper_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ulong local_f8;
  size_t local_f0;
  uint16_t *local_e8;
  string local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<int,_std::allocator<int>_> mapping;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Iter_comp_iter<writeHash2<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
            ((layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  upper_name._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&mapping,n2 + 1,(value_type_conflict4 *)&upper_name,(allocator_type *)&local_118);
  puVar3 = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar1 = *seed;
  for (lVar7 = 0; (long)puVar4 - (long)puVar3 >> 1 != lVar7; lVar7 = lVar7 + 1) {
    uVar2 = puVar3[lVar7];
    uVar10 = (uint)(ushort)(uVar2 >> 7 ^ uVar2);
    uVar9 = uVar10 * uVar1;
    uVar10 = (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
             )._M_impl.super__Vector_impl_data._M_start[(uint)n1 & (uVar9 >> 7 ^ uVar9)].seed *
             uVar10;
    mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(uint)n2 & (uVar10 >> 7 ^ uVar10)] = (int)lVar7;
  }
  local_e8 = seed;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,vals);
  std::__cxx11::string::string((string *)&local_90,(string *)map_name._M_dataplus._M_p);
  getCommonCodeGen<unsigned_short>
            (&upper_name,keys,&local_c0,&mapping,n2,&local_90,(bool)map_name.field_2._M_local_buf[0]
            );
  std::__cxx11::string::operator=((string *)hash_str,(string *)&upper_name);
  std::__cxx11::string::~string((string *)&upper_name);
  std::__cxx11::string::~string((string *)&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  std::__cxx11::to_string(&local_e0,n1 + 1);
  std::operator+(&local_118,"    static constexpr std::array<uint16_t, ",&local_e0);
  std::operator+(&upper_name,&local_118,"> seeds {\n        ");
  local_f8 = (ulong)(byte)map_name.field_2._M_local_buf[0];
  local_f0 = n2;
  std::__cxx11::string::append((string *)hash_str);
  std::__cxx11::string::~string((string *)&upper_name);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_e0);
  pBVar11 = (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar5 = (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar12 = 0;
  lVar7 = 0;
  while( true ) {
    if (pBVar11 == pBVar5) break;
    if ((lVar7 != 0) && (lVar7 + (uVar12 / 10) * 10 == 0)) {
      std::__cxx11::string::append((char *)hash_str);
    }
    std::__cxx11::to_string(&local_118,(uint)pBVar11->seed);
    std::operator+(&upper_name,&local_118,",");
    std::__cxx11::string::append((string *)hash_str);
    std::__cxx11::string::~string((string *)&upper_name);
    std::__cxx11::string::~string((string *)&local_118);
    pBVar11 = pBVar11 + 1;
    uVar12 = uVar12 + 1;
    lVar7 = lVar7 + -1;
  }
  std::__cxx11::string::append((char *)hash_str);
  seed_00 = *local_e8;
  std::__cxx11::string::string((string *)&local_50,(string *)map_name._M_dataplus._M_p);
  n2_00 = local_f0;
  sVar8 = 0;
  typeStr_abi_cxx11_(&local_70,0);
  hashStr2(&upper_name,sVar8,seed_00,n1,n2_00,(string *)map_name._M_string_length,&local_50,
           &local_70,SUB81(local_f8,0));
  std::__cxx11::string::append((string *)hash_str);
  std::__cxx11::string::~string((string *)&upper_name);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&upper_name,(string *)map_name._M_dataplus._M_p);
  lVar7 = CONCAT44(upper_name._M_dataplus._M_p._4_4_,upper_name._M_dataplus._M_p._0_4_);
  for (sVar13 = 0; upper_name._M_string_length != sVar13; sVar13 = sVar13 + 1) {
    iVar6 = toupper((int)*(char *)(lVar7 + sVar13));
    *(char *)(lVar7 + sVar13) = (char)iVar6;
  }
  std::operator+(&local_e0,"#endif // POIFECT_",&upper_name);
  std::operator+(&local_118,&local_e0,"_H\n");
  std::__cxx11::string::append((string *)hash_str);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&upper_name);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mapping.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void writeHash2(const std::vector<KeyType>& keys,
               const SeedType& seed,
               size_t n1,
               size_t n2,
               const std::vector<std::string>& vals,
               std::vector<Bin<KeyType>> layer1,
               std::string& hash_str,
               std::string map_name,
               const std::string& default_value,
               bool nonKeyLookups){

    struct LayerSort{
        inline bool operator() (const Bin<KeyType>& a, const Bin<KeyType>& b){
            return (a.generating_hash < b.generating_hash);
        }
    };
    std::sort(layer1.begin(), layer1.end(), LayerSort());

    std::vector<int> mapping(n2+1, -1);
    for(size_t i = 0; i < keys.size(); i++){
        const KeyType& key = keys[i];
        uint32_t h = hash2(key, seed) & n1;
        uint32_t s1 = layer1[h].seed;
        size_t final = hash2(key, s1) & n2;
        mapping[final] = i;
    }

    hash_str = getCommonCodeGen(keys, vals, mapping, n2, map_name, nonKeyLookups);

    hash_str += "    static constexpr std::array<uint16_t, " + std::to_string(n1+1) + "> seeds {\n        ";

    size_t i = 0;
    for(const auto& bin : layer1){
        if(i && i%entries_per_row==0) hash_str += "\n        ";
        i++;
        hash_str += std::to_string(bin.seed) + ",";
    }
    hash_str += "\n    };\n\n";

    hash_str += hashStr2(keys[0], seed, n1, n2, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";
}